

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

int __thiscall userinfo_t::SkinChanged(userinfo_t *this,char *skinname,int playerclass)

{
  int intval;
  FBaseCVar **ppFVar1;
  FName local_14;
  
  intval = R_FindSkin(skinname,playerclass);
  ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,&local_14);
  FIntCVar::operator=((FIntCVar *)*ppFVar1,intval);
  return intval;
}

Assistant:

int userinfo_t::SkinChanged(const char *skinname, int playerclass)
{
	int skinnum = R_FindSkin(skinname, playerclass);
	*static_cast<FIntCVar *>((*this)[NAME_Skin]) = skinnum;
	return skinnum;
}